

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::
to_string<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,
          basic_string_view<char,_std::char_traits<char>_> *lhs,string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  ostream *poVar1;
  basic_string_view<char,_std::char_traits<char>_> *value;
  basic_string_view<char,_std::char_traits<char>_> *value_00;
  string local_1f0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  string *op_local;
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<std::basic_string_view<char,std::char_traits<char>>>(&local_1c0,this,value);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<std::basic_string_view<char,std::char_traits<char>>>(&local_1f0,(lest *)op,value_00);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}